

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

int count_spool(CHAR_DATA *ch,int type)

{
  bool bVar1;
  MYSQL_RES *pMVar2;
  long lVar3;
  uint in_ESI;
  char query [4608];
  MYSQL_ROW row;
  MYSQL_RES *res;
  int count;
  char acStackY_1228 [8];
  MYSQL_ROW in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  int local_10;
  
  local_10 = 0;
  sprintf(acStackY_1228,"SELECT * FROM notes WHERE type=%d",(ulong)in_ESI);
  pMVar2 = one_query_res((char *)in_stack_ffffffffffffede0);
  while (lVar3 = mysql_fetch_row(pMVar2), lVar3 != 0) {
    bVar1 = hide_note(in_stack_ffffffffffffede8,in_stack_ffffffffffffede0);
    if (!bVar1) {
      local_10 = local_10 + 1;
    }
  }
  mysql_free_result(pMVar2);
  return local_10;
}

Assistant:

int count_spool(CHAR_DATA *ch, int type)
{
	int count = 0;
	MYSQL_RES *res;
	MYSQL_ROW row;
	char query[MSL];

	sprintf(query, "SELECT * FROM notes WHERE type=%d", type);
	res = one_query_res(query);

	while ((row = mysql_fetch_row(res)))
	{
		if (!hide_note(ch, row))
			count++;
	}

	mysql_free_result(res);
	return count;
}